

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abcFanOrder.c
# Opt level: O2

void Abc_NtkOrderFaninsById(Abc_Ntk_t *pNtk)

{
  int *pArray;
  uint uVar1;
  int iVar2;
  Vec_Int_t *p;
  Vec_Str_t *p_00;
  Abc_Obj_t *pAVar3;
  uint Entry;
  int i;
  char *__dest;
  int iVar4;
  ulong uVar5;
  char *pcVar6;
  uint uVar7;
  char *pcVar8;
  
  if (pNtk->ntkFunc != ABC_FUNC_SOP) {
    pcVar6 = "Abc_NtkHasSop(pNtk)";
    uVar1 = 0x36;
LAB_006a02e3:
    __assert_fail(pcVar6,
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/base/abc/abcFanOrder.c"
                  ,uVar1,"void Abc_NtkOrderFaninsById(Abc_Ntk_t *)");
  }
  p = Vec_IntAlloc((int)pNtk);
  p_00 = Vec_StrAlloc(100);
  i = 0;
  do {
    if (pNtk->vObjs->nSize <= i) {
      Vec_IntFree(p);
      Vec_StrFree(p_00);
      return;
    }
    pAVar3 = Abc_NtkObj(pNtk,i);
    if ((pAVar3 != (Abc_Obj_t *)0x0) && ((*(uint *)&pAVar3->field_0x14 & 0xf) == 7)) {
      pcVar6 = (char *)(pAVar3->field_5).pData;
      uVar1 = Abc_SopGetVarNum(pcVar6);
      if (uVar1 != (pAVar3->vFanins).nSize) {
        pcVar6 = "nVars == Abc_ObjFaninNum(pNode)";
        uVar1 = 0x3d;
        goto LAB_006a02e3;
      }
      p->nSize = 0;
      uVar7 = 0;
      Entry = 0;
      if (0 < (int)uVar1) {
        uVar7 = uVar1;
        Entry = 0;
      }
      for (; uVar7 != Entry; Entry = Entry + 1) {
        Vec_IntPush(p,Entry);
      }
      pArray = p->pArray;
      Vec_IntSelectSortCost(pArray,uVar1,&pAVar3->vFanins);
      iVar2 = Abc_SopGetCubeNum(pcVar6);
      iVar4 = uVar1 + 3;
      Vec_StrGrow(p_00,iVar2 * iVar4 + 1);
      __dest = p_00->pArray;
      iVar2 = Abc_SopGetCubeNum(pcVar6);
      memcpy(__dest,pcVar6,(long)(iVar2 * iVar4 + 1));
      pcVar8 = pcVar6;
      for (; *__dest != '\0'; __dest = __dest + iVar4) {
        for (uVar5 = 0; uVar7 != uVar5; uVar5 = uVar5 + 1) {
          pcVar8[uVar5] = '-';
        }
        for (uVar5 = 0; uVar7 != uVar5; uVar5 = uVar5 + 1) {
          if ((__dest[pArray[uVar5]] & 0xfeU) == 0x30) {
            pcVar8[uVar5] = __dest[pArray[uVar5]];
          }
        }
        pcVar8 = pcVar8 + iVar4;
      }
      (pAVar3->field_5).pData = pcVar6;
      qsort((pAVar3->vFanins).pArray,(long)(pAVar3->vFanins).nSize,4,Vec_IntSortCompare1);
    }
    i = i + 1;
  } while( true );
}

Assistant:

ABC_NAMESPACE_IMPL_START


////////////////////////////////////////////////////////////////////////
///                        DECLARATIONS                              ///
////////////////////////////////////////////////////////////////////////
 
////////////////////////////////////////////////////////////////////////
///                     FUNCTION DEFINITIONS                         ///
////////////////////////////////////////////////////////////////////////


/**Function*************************************************************

  Synopsis    [Reorder fanins of the network.]

  Description []
               
  SideEffects []

  SeeAlso     []

***********************************************************************/
void Abc_NtkOrderFaninsById( Abc_Ntk_t * pNtk )
{
    Vec_Int_t * vOrder;
    Vec_Str_t * vStore;
    Abc_Obj_t * pNode;
    char * pSop, * pSopNew;
    char * pCube, * pCubeNew;
    int nVars, i, v, * pOrder;
    assert( Abc_NtkHasSop(pNtk) );
    vOrder = Vec_IntAlloc( 100 );
    vStore = Vec_StrAlloc( 100 );
    Abc_NtkForEachNode( pNtk, pNode, i )
    {
        pSop = (char *)pNode->pData;
        nVars = Abc_SopGetVarNum(pSop);
        assert( nVars == Abc_ObjFaninNum(pNode) );
        Vec_IntClear( vOrder );
        for ( v = 0; v < nVars; v++ )
            Vec_IntPush( vOrder, v );
        pOrder = Vec_IntArray(vOrder);
        Vec_IntSelectSortCost( pOrder, nVars, &pNode->vFanins );
        // copy the cover
        Vec_StrGrow( vStore, Abc_SopGetCubeNum(pSop) * (nVars + 3) + 1 );
        memcpy( Vec_StrArray(vStore), pSop, (size_t)(Abc_SopGetCubeNum(pSop) * (nVars + 3) + 1) );
        pSopNew = pCubeNew = pSop;
        pSop = Vec_StrArray(vStore);
        // generate permuted one
        Abc_SopForEachCube( pSop, nVars, pCube )
        {
            for ( v = 0; v < nVars; v++ )
                pCubeNew[v] = '-';
            for ( v = 0; v < nVars; v++ )
                if ( pCube[pOrder[v]] == '0' )
                    pCubeNew[v] = '0';
                else if ( pCube[pOrder[v]] == '1' )
                    pCubeNew[v] = '1';
            pCubeNew += nVars + 3;
        }
        pNode->pData = pSopNew;
        Vec_IntSort( &pNode->vFanins, 0 );
//        Vec_IntPrint( vOrder );
    }
    Vec_IntFree( vOrder );
    Vec_StrFree( vStore );
}